

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zonestack.h
# Opt level: O3

RABlock * __thiscall
asmjit::v1_14::ZoneStack<asmjit::v1_14::RABlock_*>::popFirst
          (ZoneStack<asmjit::v1_14::RABlock_*> *this)

{
  int *piVar1;
  byte bVar2;
  Error EVar3;
  RABlock *extraout_RAX;
  ZoneAllocator *pZVar4;
  undefined4 extraout_var;
  RABlock *pRVar5;
  ulong uVar6;
  undefined4 extraout_var_00;
  undefined8 *in_RCX;
  ZoneAllocator *pZVar7;
  long *plVar8;
  long *plVar9;
  uint uVar10;
  undefined4 extraout_EDX;
  ulong uVar11;
  undefined8 *extraout_RDX;
  ZoneAllocator *pZVar12;
  ZoneAllocator *pZVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  uint uVar17;
  ZoneVectorBase *unaff_RBX;
  ulong unaff_RBP;
  ZoneAllocator *in_RSI;
  long *plVar18;
  long *plVar19;
  uint uVar20;
  uint *puVar21;
  undefined2 uVar22;
  uint *in_R8;
  uint *puVar23;
  ulong uVar24;
  long lVar25;
  long *plVar26;
  ZoneAllocator *pZVar27;
  long lVar28;
  long *plVar29;
  uint uVar30;
  ulong uVar31;
  ZoneVectorBase *this_00;
  bool bVar32;
  long *plStack_4d0;
  ulong uStack_4c8;
  ZoneVectorBase ZStack_4c0;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 uStack_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined8 uStack_480;
  undefined8 uStack_478;
  undefined8 uStack_470;
  undefined8 uStack_468;
  uint *puStack_b8;
  ulong uStack_b0;
  size_t sStack_80;
  ZoneVectorBase *pZStack_78;
  undefined8 *puStack_60;
  code *pcStack_58;
  ZoneAllocator *pZStack_50;
  ZoneAllocator *pZStack_48;
  ZoneVectorBase *pZStack_40;
  
  if (*(long *)this == 0) {
    ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  }
  else {
    lVar14 = *(long *)&this->field_0x8;
    in_RCX = *(undefined8 **)(lVar14 + 0x10);
    if (in_RCX != *(undefined8 **)(*(long *)&this->field_0x10 + 0x18)) {
      if (in_RCX != *(undefined8 **)(lVar14 + 0x18)) {
        pRVar5 = (RABlock *)*in_RCX;
        *(undefined8 **)(lVar14 + 0x10) = in_RCX + 1;
        if (in_RCX + 1 == *(undefined8 **)(lVar14 + 0x18)) {
          ZoneStackBase::_cleanupBlock(&this->super_ZoneStackBase,0,0x110);
        }
        return pRVar5;
      }
      goto LAB_00128da3;
    }
  }
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
LAB_00128da3:
  ZoneStack<asmjit::v1_14::RABlock*>::popFirst();
  pRVar5 = *(RABlock **)&((ZoneVectorBase *)this)->_data;
  if (pRVar5 == (RABlock *)0x0) {
    return (RABlock *)0x0;
  }
  if (*(long *)in_RSI == 0) {
    ZoneVector<unsigned_int>::release();
  }
  else {
    uVar10 = ((ZoneVectorBase *)this)->_capacity << 2;
    uVar11 = (ulong)uVar10;
    unaff_RBX = (ZoneVectorBase *)this;
    if (uVar11 != 0) {
      if (uVar10 < 0x201) {
        if (uVar10 < 0x81) {
          uVar11 = uVar11 + 0x1fffffffff >> 5;
        }
        else {
          uVar11 = (uVar11 + 0x3fffffff7f >> 6) + 4;
        }
        *(undefined8 *)pRVar5 = *(undefined8 *)(in_RSI + (uVar11 & 0xffffffff) * 8 + 8);
        *(RABlock **)(in_RSI + (uVar11 & 0xffffffff) * 8 + 8) = pRVar5;
      }
      else {
        ZoneAllocator::_releaseDynamic(in_RSI,pRVar5,uVar11);
        pRVar5 = extraout_RAX;
      }
      *(undefined8 *)&((ZoneVectorBase *)this)->_data = 0;
      ((ZoneVectorBase *)this)->_size = 0;
      ((ZoneVectorBase *)this)->_capacity = 0;
      return pRVar5;
    }
  }
  ZoneVector<unsigned_int>::release();
  if (in_RSI < (ZoneAllocator *)(ulong)((ZoneVectorBase *)this)->_size) {
    return (RABlock *)((long)in_RSI * 8 + *(long *)&((ZoneVectorBase *)this)->_data);
  }
  ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
  uVar30 = *(uint *)(extraout_RDX + 1);
  uVar17 = *(uint *)(in_RCX + 1);
  uVar10 = uVar17 + uVar30;
  pZStack_40 = unaff_RBX;
  if (((ZoneVectorBase *)this)->_capacity < uVar10) goto LAB_00128f8c;
  do {
    pZVar7 = (ZoneAllocator *)((ZoneVectorBase *)this)->_data;
    puVar21 = (uint *)*extraout_RDX;
    pZVar13 = (ZoneAllocator *)*in_RCX;
    puVar23 = puVar21 + (ulong)uVar30 * 3;
    in_RSI = pZVar13 + (ulong)uVar17 * 0xc;
    pZVar4 = pZVar7;
    if (uVar17 != 0 && uVar30 != 0) {
      uVar10 = *puVar21;
      pZVar12 = pZVar13;
      pZVar27 = pZVar7;
      do {
        while (uVar30 = *(uint *)(pZVar12 + 4), uVar10 < uVar30) {
          uVar10 = *(uint *)pZVar12;
          while (uVar30 = puVar21[1], uVar30 <= uVar10) {
            pZVar4 = pZVar27 + 0xc;
            unaff_RBP = (ulong)*puVar21;
            *(uint *)pZVar27 = *puVar21;
            *(uint *)(pZVar27 + 4) = uVar30;
            *(uint *)(pZVar27 + 8) = puVar21[2];
            puVar21 = puVar21 + 3;
            pZVar13 = pZVar12;
            pZVar27 = pZVar4;
            if (puVar21 == puVar23) goto LAB_00128f35;
          }
          uVar10 = *puVar21;
          if (uVar10 < *(uint *)(pZVar12 + 4)) {
            return (RABlock *)0xffffffff;
          }
        }
        *(uint *)pZVar27 = *(uint *)pZVar12;
        *(uint *)(pZVar27 + 4) = uVar30;
        *(uint *)(pZVar27 + 8) = *in_R8;
        pZVar27 = pZVar27 + 0xc;
        pZVar12 = pZVar12 + 0xc;
        pZVar13 = in_RSI;
        pZVar4 = pZVar27;
      } while (pZVar12 != in_RSI);
    }
    for (; puVar21 != puVar23; puVar21 = puVar21 + 3) {
      *(long *)pZVar4 = *(long *)puVar21;
      *(uint *)(pZVar4 + 8) = puVar21[2];
      pZVar4 = pZVar4 + 0xc;
    }
LAB_00128f35:
    if (pZVar13 != in_RSI) {
      uVar10 = *in_R8;
      puVar21 = (uint *)(ulong)uVar10;
      do {
        puVar23 = *(uint **)pZVar13;
        *(uint **)pZVar4 = puVar23;
        *(uint *)(pZVar4 + 8) = uVar10;
        pZVar4 = pZVar4 + 0xc;
        pZVar13 = pZVar13 + 0xc;
      } while (pZVar13 != in_RSI);
    }
    uVar22 = SUB82(puVar23,0);
    if (pZVar7 <= pZVar4) {
      in_RSI = pZVar7 + (ulong)((ZoneVectorBase *)this)->_capacity * 0xc;
      if (pZVar4 <= in_RSI) {
        uVar10 = (int)((ulong)((long)pZVar4 - (long)pZVar7) >> 2) * -0x55555555;
        if (uVar10 <= ((ZoneVectorBase *)this)->_capacity) {
          ((ZoneVectorBase *)this)->_size = uVar10;
          return (RABlock *)0x0;
        }
        pZStack_48 = (ZoneAllocator *)ZoneVector<asmjit::v1_14::RAWorkReg_*>::operator[];
        RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
        uVar10 = (uint)pZVar7;
        pZStack_48 = (ZoneAllocator *)(ulong)puVar21[2];
        if (in_RSI < pZStack_48) {
          return (RABlock *)((long)in_RSI * 8 + *(long *)puVar21);
        }
        pZStack_50 = (ZoneAllocator *)0x128fc9;
        ZoneVector<asmjit::v1_14::RAWorkReg*>::operator[]();
        pZStack_50 = (ZoneAllocator *)(ulong)puVar21[2];
        if (in_RSI < pZStack_50) {
          return (RABlock *)((long)in_RSI * 0xc + *(long *)puVar21);
        }
        pcStack_58 = RAStackAllocator::newSlot;
        ZoneVector<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::operator[]();
        pZStack_78 = (ZoneVectorBase *)this;
        puStack_60 = in_RCX;
        pcStack_58 = (code *)unaff_RBP;
        if ((puVar21[9] == puVar21[8]) &&
           (EVar3 = ZoneVectorBase::_grow
                              ((ZoneVectorBase *)(puVar21 + 6),*(ZoneAllocator **)puVar21,8,1),
           EVar3 != 0)) {
          return (RABlock *)0x0;
        }
        pZVar4 = *(ZoneAllocator **)puVar21;
        if (*(long *)pZVar4 == 0) {
          RAStackAllocator::newSlot();
        }
        else {
          pRVar5 = (RABlock *)ZoneAllocator::_alloc(pZVar4,0x14,&sStack_80);
          if (pRVar5 == (RABlock *)0x0) {
            return (RABlock *)0x0;
          }
          *pRVar5 = SUB81((ulong)in_RSI & 0xffffffff,0);
          pRVar5[1] = (RABlock)((char)uVar10 + (uVar10 == 0));
          *(undefined2 *)(pRVar5 + 2) = uVar22;
          *(undefined4 *)(pRVar5 + 8) = 0;
          *(undefined4 *)(pRVar5 + 4) = extraout_EDX;
          *(undefined8 *)(pRVar5 + 0xc) = 0;
          if (uVar10 < puVar21[4]) {
            uVar10 = puVar21[4];
          }
          puVar21[4] = uVar10;
          if (puVar21[8] < puVar21[9]) {
            *(RABlock **)(*(long *)(puVar21 + 6) + (ulong)puVar21[8] * 8) = pRVar5;
            puVar21[8] = puVar21[8] + 1;
            return pRVar5;
          }
        }
        RAStackAllocator::newSlot();
        uStack_b0 = (ulong)in_RSI & 0xffffffff;
        puStack_b8 = puVar21;
        plVar8 = *(long **)(pZVar4 + 0x18);
        uVar11 = (ulong)*(uint *)(pZVar4 + 0x20);
        if (uVar11 == 0) goto LAB_0012912a;
        plVar18 = (long *)0x0;
        break;
      }
    }
    pZStack_48 = (ZoneAllocator *)0x128f8c;
    RALiveSpans<asmjit::v1_14::RALiveSpan<asmjit::v1_14::LiveRegData>>::nonOverlappingUnionOf();
    uVar10 = (uint)pZVar7;
LAB_00128f8c:
    pZStack_48 = (ZoneAllocator *)0x128f99;
    EVar3 = ZoneVectorBase::_growingReserve((ZoneVectorBase *)this,in_RSI,0xc,uVar10);
    if (EVar3 != 0) {
      return (RABlock *)CONCAT44(extraout_var,EVar3);
    }
    uVar30 = *(uint *)(extraout_RDX + 1);
    uVar17 = *(uint *)(in_RCX + 1);
  } while( true );
  while( true ) {
    uVar10 = 0;
    if (bVar2 != 0) {
      for (; (bVar2 >> uVar10 & 1) == 0; uVar10 = uVar10 + 1) {
      }
    }
    uVar30 = 6;
    if ((char)uVar10 != '\a') {
      uVar30 = uVar10;
    }
    if ((*(byte *)(lVar14 + 2) & 1) == 0) {
      uVar24 = (ulong)(uVar30 & 0xff);
    }
    else {
      uVar24 = (ulong)(byte)((byte)uVar30 ^ 7) * (ulong)*(uint *)(lVar14 + 8) + 0x10;
    }
    if (0xfffffffe < uVar24) {
      uVar24 = 0xffffffff;
    }
    *(int *)(lVar14 + 0xc) = (int)uVar24;
    plVar18 = plVar18 + 1;
    if (uVar11 * 8 - (long)plVar18 == 0) break;
    lVar14 = *(long *)((long)plVar8 + (long)plVar18);
    bVar2 = *(byte *)(lVar14 + 1);
    if (bVar2 == 0) goto LAB_00129481;
  }
LAB_0012912a:
  lVar14 = 0;
  plVar18 = plVar8 + uVar11;
LAB_00129130:
  do {
    uVar24 = (long)plVar18 - (long)plVar8 >> 3;
    if (7 < uVar24) {
      plVar19 = plVar18 + -1;
      lVar28 = *(long *)((long)plVar8 + (uVar24 & 0xfffffffffffffffe) * 4);
      *(long *)((long)plVar8 + (uVar24 & 0xfffffffffffffffe) * 4) = *plVar8;
      *plVar8 = lVar28;
      lVar15 = plVar8[1];
      lVar25 = plVar18[-1];
      uVar10 = *(uint *)(lVar15 + 0xc);
      uVar30 = *(uint *)(lVar25 + 0xc);
      if (uVar30 < uVar10) {
        plVar8[1] = lVar25;
        *plVar19 = lVar15;
        lVar28 = *plVar8;
        lVar25 = lVar15;
        uVar30 = uVar10;
      }
      uVar10 = *(uint *)(lVar28 + 0xc);
      if (uVar30 < uVar10) {
        *plVar8 = lVar25;
        *plVar19 = lVar28;
        lVar28 = *plVar8;
        uVar10 = *(uint *)(lVar28 + 0xc);
      }
      plVar26 = plVar8 + 1;
      lVar15 = *plVar26;
      if (uVar10 < *(uint *)(lVar15 + 0xc)) {
        plVar8[1] = lVar28;
        *plVar8 = lVar15;
      }
LAB_00129218:
      if (plVar26 < plVar19) break;
      goto LAB_00129232;
    }
    if ((plVar8 != plVar18) && (1 < uVar24)) {
      plVar19 = plVar8 + 1;
      do {
        if (plVar8 < plVar19) {
          lVar15 = *plVar19;
          uVar10 = *(uint *)(lVar15 + 0xc);
          plVar26 = plVar19;
          do {
            lVar25 = plVar26[-1];
            if (*(uint *)(lVar25 + 0xc) <= uVar10) break;
            plVar26[-1] = lVar15;
            *plVar26 = lVar25;
            plVar26 = plVar26 + -1;
          } while (plVar8 < plVar26);
        }
        plVar19 = plVar19 + 1;
      } while (plVar19 < (long *)(((long)plVar18 - (long)plVar8) + (long)plVar8));
    }
    if (lVar14 == 0) {
      uStack_470 = 0;
      uStack_468 = 0;
      uStack_480 = 0;
      uStack_478 = 0;
      uStack_490 = 0;
      uStack_488 = 0;
      uStack_4a0 = 0;
      uStack_498 = 0;
      uStack_4b0 = 0;
      uStack_4a8 = 0;
      ZStack_4c0._data = (void *)0x0;
      ZStack_4c0._size = 0;
      ZStack_4c0._capacity = 0;
      if (uVar11 == 0) {
        iVar16 = -1;
        goto LAB_0012945a;
      }
      plVar18 = *(long **)(pZVar4 + 0x18);
      plVar8 = plVar18 + uVar11;
      uVar11 = 0;
      goto LAB_001292e2;
    }
    plVar8 = *(long **)((long)&plStack_4d0 + lVar14);
    plVar18 = *(long **)((long)&uStack_4c8 + lVar14);
    lVar14 = lVar14 + -0x10;
  } while( true );
  plVar9 = plVar26 + 1;
  plVar26 = plVar26 + 1;
  if (*(uint *)(*plVar9 + 0xc) < *(uint *)(*plVar8 + 0xc)) goto LAB_00129218;
LAB_00129232:
  do {
    if (plVar19 <= plVar8) break;
    plVar9 = plVar19 + -1;
    plVar19 = plVar19 + -1;
  } while (*(uint *)(*plVar8 + 0xc) < *(uint *)(*plVar9 + 0xc));
  if (plVar26 <= plVar19) {
    lVar15 = *plVar26;
    *plVar26 = *plVar19;
    *plVar19 = lVar15;
    goto LAB_00129218;
  }
  lVar15 = *plVar8;
  *plVar8 = *plVar19;
  *plVar19 = lVar15;
  plVar9 = plVar8;
  plVar29 = plVar18;
  if ((long)plVar18 - (long)plVar26 < (long)plVar19 - (long)plVar8) {
    plVar9 = plVar26;
    plVar26 = plVar8;
    plVar29 = plVar19;
    plVar19 = plVar18;
  }
  *(long **)((long)&ZStack_4c0._data + lVar14) = plVar26;
  *(long **)((long)&ZStack_4c0._size + lVar14) = plVar29;
  if (0x3f0 < lVar14) goto LAB_0012947c;
  lVar14 = lVar14 + 0x10;
  plVar8 = plVar9;
  plVar18 = plVar19;
  goto LAB_00129130;
LAB_001292e2:
  lVar14 = *plVar18;
  if ((*(byte *)(lVar14 + 2) & 2) == 0) {
    bVar2 = *(byte *)(lVar14 + 1);
    uVar30 = -(uint)bVar2 & ((int)uVar11 + (uint)bVar2) - 1;
    uVar10 = *(uint *)(lVar14 + 4);
    uVar24 = (ulong)uVar10;
    if (uVar10 < 0x40) {
      iVar16 = 0;
      if (uVar10 != 0) {
        for (; (uVar10 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
        }
      }
      uVar6 = (ulong)(uint)(iVar16 << 4) | 8;
      do {
        iVar16 = *(int *)((long)&ZStack_4c0._data + uVar6);
        if (iVar16 != 0) {
          uVar20 = iVar16 - 1;
          pZVar7 = (ZoneAllocator *)(ulong)uVar20;
          *(uint *)((long)&ZStack_4c0._data + uVar6) = uVar20;
          uVar17 = *(uint *)(*(long *)((long)&uStack_4c8 + uVar6) + (long)pZVar7 * 8);
          if (uVar17 % (uint)bVar2 != 0) goto LAB_0012948b;
          iVar16 = *(int *)(*(long *)((long)&uStack_4c8 + uVar6) + 4 + (long)pZVar7 * 8);
          *(uint *)(lVar14 + 0x10) = uVar17;
          iVar16 = iVar16 - uVar10;
          uVar6 = (ulong)(uVar17 - uVar10);
          bVar32 = true;
          pZVar7 = (ZoneAllocator *)CONCAT71((uint7)(uint3)(uVar20 >> 8),1);
          goto LAB_00129369;
        }
        uVar6 = uVar6 + 0x10;
      } while (uVar6 != 0x68);
    }
    iVar16 = uVar30 - (int)uVar11;
    bVar32 = iVar16 == 0;
    uVar6 = 0;
    pZVar7 = (ZoneAllocator *)0x0;
    uVar11 = (ulong)uVar30;
LAB_00129369:
    if (iVar16 != 0) {
      uVar31 = (ulong)uVar30;
      if (bVar32) {
        uVar31 = uVar6;
      }
      uVar30 = (uint)uVar31;
      uVar17 = iVar16 + uVar30;
      while (uVar10 = (uint)uVar24, uVar30 < uVar17) {
        iVar16 = 0;
        uVar20 = (uint)uVar31;
        if (uVar20 != 0) {
          for (; (uVar20 >> iVar16 & 1) == 0; iVar16 = iVar16 + 1) {
          }
        }
        uVar30 = 1 << ((byte)iVar16 & 0x1f);
        if (uVar17 - uVar20 < uVar30) break;
        uVar6 = (ulong)(uint)(iVar16 << 4);
        this_00 = (ZoneVectorBase *)((long)&ZStack_4c0._data + uVar6);
        uVar10 = *(uint *)((long)&ZStack_4c0._size + uVar6);
        if (uVar10 == *(uint *)((long)&ZStack_4c0._capacity + uVar6)) {
          plStack_4d0 = plVar8;
          uStack_4c8 = uVar11;
          EVar3 = ZoneVectorBase::_grow(this_00,*(ZoneAllocator **)pZVar4,8,1);
          if (EVar3 != 0) {
            return (RABlock *)CONCAT44(extraout_var_00,EVar3);
          }
          uVar10 = *(uint *)((long)&ZStack_4c0._size + uVar6);
          uVar11 = uStack_4c8;
          plVar8 = plStack_4d0;
        }
        uVar24 = uVar31 | (ulong)uVar30 << 0x20;
        *(ulong *)((long)this_00->_data + (ulong)uVar10 * 8) = uVar24;
        piVar1 = (int *)((long)&ZStack_4c0._size + uVar6);
        *piVar1 = *piVar1 + 1;
        uVar30 = uVar30 + uVar20;
        uVar31 = (ulong)uVar30;
      }
    }
    if ((char)pZVar7 == '\0') {
      if ((int)((uVar11 & 0xffffffff) % (ulong)bVar2) != 0) goto LAB_00129486;
      *(int *)(lVar14 + 0x10) = (int)uVar11;
      uVar11 = (ulong)(uint)((int)uVar11 + *(int *)(lVar14 + 4));
    }
  }
  plVar18 = plVar18 + 1;
  if (plVar18 == plVar8) {
    iVar16 = (int)uVar11 + -1;
LAB_0012945a:
    *(int *)(pZVar4 + 0xc) = -*(int *)(pZVar4 + 0x10) & iVar16 + *(int *)(pZVar4 + 0x10);
    return (RABlock *)0x0;
  }
  goto LAB_001292e2;
LAB_0012947c:
  RAStackAllocator::calculateStackFrame();
LAB_00129481:
  uVar10 = (uint)plVar18;
  RAStackAllocator::calculateStackFrame();
  pZVar7 = pZVar4;
LAB_00129486:
  RAStackAllocator::calculateStackFrame();
LAB_0012948b:
  RAStackAllocator::calculateStackFrame();
  uVar30 = *(uint *)(pZVar7 + 0x20);
  if ((ulong)uVar30 != 0) {
    lVar14 = *(long *)(pZVar7 + 0x18);
    lVar15 = 0;
    do {
      if ((*(byte *)(*(long *)(lVar14 + lVar15) + 2) & 2) == 0) {
        piVar1 = (int *)(*(long *)(lVar14 + lVar15) + 0x10);
        *piVar1 = *piVar1 + uVar10;
      }
      lVar15 = lVar15 + 8;
    } while ((ulong)uVar30 << 3 != lVar15);
  }
  return (RABlock *)0x0;
}

Assistant:

inline T popFirst() noexcept {
    ASMJIT_ASSERT(isInitialized());
    ASMJIT_ASSERT(!empty());

    Block* block = _block[kBlockIndexFirst];
    ASMJIT_ASSERT(!block->empty());

    T* ptr = block->start<T>();
    T item = *ptr++;

    block->setStart(ptr);
    if (block->empty())
      _cleanupBlock(kBlockIndexFirst, kMidBlockIndex);

    return item;
  }